

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpContext.h
# Opt level: O3

int __thiscall glslang::TPpContext::tTokenInput::scan(tTokenInput *this,TPpToken *ppToken)

{
  TokenStream *pTVar1;
  TPpContext *pTVar2;
  int iVar3;
  int iVar4;
  _Rb_tree_header *p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  
  iVar3 = TokenStream::getToken(this->tokens,((this->super_tInput).pp)->parseContext,ppToken);
  ppToken->fullyExpanded = this->preExpanded;
  if ((iVar3 == 0xa2) &&
     (pTVar1 = this->tokens,
     (ulong)(((long)(pTVar1->stream).
                    super_vector<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
                    .
                    super__Vector_base<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pTVar1->stream).
                    super_vector<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
                    .
                    super__Vector_base<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7) <=
     pTVar1->currentPos)) {
    iVar4 = TStringAtomMap::getAtom(&((this->super_tInput).pp)->atomStrings,ppToken->name);
    if (iVar4 != 0) {
      pTVar2 = (this->super_tInput).pp;
      p_Var7 = (pTVar2->macroDefs).
               super_map<int,_glslang::TPpContext::MacroSymbol,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TPpContext::MacroSymbol>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var7 != (_Base_ptr)0x0) {
        p_Var5 = &(pTVar2->macroDefs).
                  super_map<int,_glslang::TPpContext::MacroSymbol,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TPpContext::MacroSymbol>_>_>
                  ._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = &p_Var5->_M_header;
        do {
          if (iVar4 <= (int)p_Var7[1]._M_color) {
            p_Var6 = p_Var7;
          }
          p_Var7 = (&p_Var7->_M_left)[(int)p_Var7[1]._M_color < iVar4];
        } while (p_Var7 != (_Base_ptr)0x0);
        if ((((_Rb_tree_header *)p_Var6 != p_Var5) && ((int)p_Var6[1]._M_color <= iVar4)) &&
           (((ulong)p_Var6[3]._M_left & 1) != 0)) {
          ppToken->fullyExpanded = false;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

virtual int scan(TPpToken *ppToken) override {
            int token = tokens->getToken(pp->parseContext, ppToken);
            ppToken->fullyExpanded = preExpanded;
            if (tokens->atEnd() && token == PpAtomIdentifier) {
                int macroAtom = pp->atomStrings.getAtom(ppToken->name);
                MacroSymbol* macro = macroAtom == 0 ? nullptr : pp->lookupMacroDef(macroAtom);
                if (macro && macro->functionLike)
                    ppToken->fullyExpanded = false;
            }
            return token;
        }